

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl-read.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  FILE *__stream;
  _func_void_tmidl_diagnostic_t_ptr_void_ptr *__n;
  char *input;
  tmidl_parser_o *parser_00;
  _Bool success;
  tmidl_parser_o *parser;
  tmidl_callbacks_i callbacks;
  size_t i;
  char *data;
  size_t size;
  FILE *file;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("File to read not specified!");
    argv_local._4_4_ = 1;
  }
  else if (argc < 3) {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      printf("Failed to open target file!\n");
      argv_local._4_4_ = 1;
    }
    else {
      fseek(__stream,0,2);
      __n = (_func_void_tmidl_diagnostic_t_ptr_void_ptr *)ftell(__stream);
      fseek(__stream,0,0);
      input = (char *)malloc((size_t)(__n + 1));
      fread(input,1,(size_t)__n,__stream);
      fclose(__stream);
      input[(long)__n] = '\0';
      for (callbacks.on_diagnostic = (_func_void_tmidl_diagnostic_t_ptr_void_ptr *)0x0;
          callbacks.on_diagnostic < __n; callbacks.on_diagnostic = callbacks.on_diagnostic + 1) {
        if (input[(long)callbacks.on_diagnostic] == '\0') {
          printf("File contained null, not allowed.");
          free(input);
          return 1;
        }
      }
      parser = (tmidl_parser_o *)on_declaration;
      callbacks.on_declaration = on_module_doc;
      callbacks.on_module_doc = on_diagnostic;
      parser_00 = tmidl_parser_create();
      _Var1 = tmidl_parser_parse(parser_00,input,(tmidl_callbacks_i *)&parser,(void *)0x0);
      tmidl_parser_destroy(parser_00);
      free(input);
      if (_Var1) {
        argv_local._4_4_ = 0;
      }
      else {
        printf("Parsing failed!\n");
        argv_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("Too many arguments!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 2) {
        printf("File to read not specified!");
        return 1;
    }
    if (argc > 2) {
        printf("Too many arguments!\n");
        return 1;
    }

    FILE *file = fopen(argv[1], "rb");
    if (file == NULL) {
        printf("Failed to open target file!\n");
        return 1;
    }

    // Find the size of the file
    fseek(file, 0, SEEK_END);
    size_t size = ftell(file);
    fseek(file, 0, SEEK_SET);

    // Read the entire file to memory
    char *data = malloc(size + 1);
    fread(data, 1, size, file);
    fclose(file);
    data[size] = 0;

    // Validate the file did not contain any nulls, as those make the string invalid
    for (size_t i = 0; i < size; i++) {
        if (data[i] == 0) {
            printf("File contained null, not allowed.");
            free(data);
            return 1;
        }
    }

    // Parse the file
    tmidl_callbacks_i callbacks = {
        .on_declaration = on_declaration,
        .on_module_doc = on_module_doc,
        .on_diagnostic = on_diagnostic
    };
    tmidl_parser_o *parser = tmidl_parser_create();
    bool success = tmidl_parser_parse(parser, data, &callbacks, NULL);
    tmidl_parser_destroy(parser);
    free(data);

    if (!success) {
        printf("Parsing failed!\n");
        return 1;
    }

    return 0;
}